

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void bng_dialog(t_bng *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  int iVar1;
  t_symbol *s_00;
  t_float tVar2;
  t_float tVar3;
  t_float tVar4;
  undefined1 local_178 [8];
  t_atom undo [18];
  int sr_flags;
  int ftbreak;
  int fthold;
  int a;
  t_symbol *srl [3];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_bng *x_local;
  
  tVar2 = atom_getfloatarg(0,argc,argv);
  tVar3 = atom_getfloatarg(2,argc,argv);
  tVar4 = atom_getfloatarg(3,argc,argv);
  undo[0x11].a_w._4_4_ = (undefined4)tVar4;
  iemgui_setdialogatoms(&x->x_gui,0x12,(t_atom *)local_178);
  undo[0].a_w.w_float = 1.4013e-45;
  undo[1].a_type = A_NULL;
  undo[1].a_w.w_float = 1.4013e-45;
  undo[2].a_type = (t_atomtype)(float)x->x_flashtime_break;
  undo[2].a_w.w_float = 1.4013e-45;
  undo[3].a_type = (t_atomtype)(float)x->x_flashtime_hold;
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,(t_atom *)local_178,argc,argv);
  undo[0x11].a_w._0_4_ = iemgui_dialog(&x->x_gui,(t_symbol **)&fthold,argc,argv);
  iVar1 = iemgui_clip_size((int)tVar2);
  (x->x_gui).x_w = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_h = (x->x_gui).x_w;
  bng_check_minmax(x,undo[0x11].a_w._4_4_,(int)tVar3);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void bng_dialog(t_bng *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = (int)atom_getfloatarg(0, argc, argv);
    int fthold = (int)atom_getfloatarg(2, argc, argv);
    int ftbreak = (int)atom_getfloatarg(3, argc, argv);
    int sr_flags;

    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT (undo+1, 0);
    SETFLOAT (undo+2, x->x_flashtime_break);
    SETFLOAT (undo+3, x->x_flashtime_hold);
    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_w = iemgui_clip_size(a) * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    bng_check_minmax(x, ftbreak, fthold);

    iemgui_size((void *)x, &x->x_gui);
}